

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O1

void __thiscall
ResultToJUnitHandler::testCaseResultComplete
          (ResultToJUnitHandler *this,TestCaseResultPtr *resultData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Writer *pWVar5;
  char *value_;
  string groupName;
  string caseName;
  TestCaseResult result;
  Attribute local_170;
  BeginElement local_130;
  Attribute local_110;
  string local_d0;
  string local_b0;
  TestCaseResult local_90;
  
  local_90.super_TestCaseResultHeader.casePath._M_dataplus._M_p =
       (pointer)&local_90.super_TestCaseResultHeader.casePath.field_2;
  local_90.super_TestCaseResultHeader.casePath._M_string_length = 0;
  local_90.super_TestCaseResultHeader.casePath.field_2._M_local_buf[0] = '\0';
  local_90.super_TestCaseResultHeader.caseType = TESTCASETYPE_LAST;
  local_90.super_TestCaseResultHeader.statusCode = TESTSTATUSCODE_LAST;
  local_90.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p =
       (pointer)&local_90.super_TestCaseResultHeader.statusDetails.field_2;
  local_90.super_TestCaseResultHeader.statusDetails._M_string_length = 0;
  local_90.super_TestCaseResultHeader.statusDetails.field_2._M_local_buf[0] = '\0';
  xe::ri::List::List(&local_90.resultItems);
  xe::parseTestCaseResultFromData(&this->m_resultParser,&local_90,resultData->m_ptr);
  std::__cxx11::string::rfind((char)&local_90,0x2e);
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_90);
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_90);
  pWVar5 = this->m_writer;
  paVar1 = &local_130.element.field_2;
  local_130.element._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"testcase","");
  pWVar5 = xe::xml::Writer::operator<<(pWVar5,&local_130);
  xe::xml::Writer::Attribute::Attribute(&local_170,"name",&local_b0);
  pWVar5 = xe::xml::Writer::operator<<(pWVar5,&local_170);
  xe::xml::Writer::Attribute::Attribute(&local_110,"classname",&local_d0);
  xe::xml::Writer::operator<<(pWVar5,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.value._M_dataplus._M_p != &local_110.value.field_2) {
    operator_delete(local_110.value._M_dataplus._M_p,
                    local_110.value.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_110.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.name._M_dataplus._M_p,local_110.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar3 = &local_170.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.value._M_dataplus._M_p != paVar3) {
    operator_delete(local_170.value._M_dataplus._M_p,
                    local_170.value.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_170.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.element._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.element._M_dataplus._M_p,
                    local_130.element.field_2._M_allocated_capacity + 1);
  }
  if (local_90.super_TestCaseResultHeader.statusCode != TESTSTATUSCODE_PASS) {
    pWVar5 = this->m_writer;
    local_110.name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"failure","");
    pWVar5 = xe::xml::Writer::operator<<(pWVar5,(BeginElement *)&local_110);
    value_ = xe::getTestStatusCodeName(local_90.super_TestCaseResultHeader.statusCode);
    xe::xml::Writer::Attribute::Attribute(&local_170,"type",value_);
    pWVar5 = xe::xml::Writer::operator<<(pWVar5,&local_170);
    pWVar5 = xe::xml::Writer::operator<<(pWVar5,&local_90.super_TestCaseResultHeader.statusDetails);
    xe::xml::Writer::operator<<(pWVar5,(EndElementType *)&xe::xml::Writer::EndElement);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_170.value._M_dataplus._M_p,
                      local_170.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.name._M_dataplus._M_p != paVar4) {
      operator_delete(local_170.name._M_dataplus._M_p,
                      local_170.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_110.name._M_dataplus._M_p,
                      local_110.name.field_2._M_allocated_capacity + 1);
    }
  }
  xe::xml::Writer::operator<<(this->m_writer,(EndElementType *)&xe::xml::Writer::EndElement);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  xe::ri::List::~List(&local_90.resultItems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p !=
      &local_90.super_TestCaseResultHeader.statusDetails.field_2) {
    operator_delete(local_90.super_TestCaseResultHeader.statusDetails._M_dataplus._M_p,
                    CONCAT71(local_90.super_TestCaseResultHeader.statusDetails.field_2.
                             _M_allocated_capacity._1_7_,
                             local_90.super_TestCaseResultHeader.statusDetails.field_2._M_local_buf
                             [0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_TestCaseResultHeader.casePath._M_dataplus._M_p !=
      &local_90.super_TestCaseResultHeader.casePath.field_2) {
    operator_delete(local_90.super_TestCaseResultHeader.casePath._M_dataplus._M_p,
                    CONCAT71(local_90.super_TestCaseResultHeader.casePath.field_2.
                             _M_allocated_capacity._1_7_,
                             local_90.super_TestCaseResultHeader.casePath.field_2._M_local_buf[0]) +
                    1);
  }
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& resultData)
	{
		using xe::xml::Writer;

		xe::TestCaseResult result;

		xe::parseTestCaseResultFromData(&m_resultParser, &result, *resultData.get());

		// Split group and case names.
		size_t			sepPos		= result.casePath.find_last_of('.');
		std::string		caseName	= result.casePath.substr(sepPos+1);
		std::string		groupName	= result.casePath.substr(0, sepPos);

		// Write result.
		m_writer << Writer::BeginElement("testcase")
				 << Writer::Attribute("name", caseName)
				 << Writer::Attribute("classname", groupName);

		if (result.statusCode != xe::TESTSTATUSCODE_PASS)
			m_writer << Writer::BeginElement("failure")
					 << Writer::Attribute("type", xe::getTestStatusCodeName(result.statusCode))
					 << result.statusDetails
					 << Writer::EndElement;

		m_writer << Writer::EndElement;
	}